

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.cpp
# Opt level: O2

void __thiscall OpenMD::StuntDouble::zeroForcesAndTorques(StuntDouble *this)

{
  uint uVar1;
  
  uVar1 = DataStorage::getStorageLayout
                    ((DataStorage *)
                     ((long)&(this->snapshotMan_->currentSnapshot_->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + this->storage_));
  if ((uVar1 & 4) != 0) {
    setFrc(this,(Vector3d *)OpenMD::V3Zero);
  }
  if ((uVar1 & 0x20) != 0) {
    setTrq(this,(Vector3d *)OpenMD::V3Zero);
  }
  if ((uVar1 & 0x40) != 0) {
    *(undefined8 *)
     (*(long *)((long)&(this->snapshotMan_->currentSnapshot_->atomData).particlePot.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + this->storage_) +
     (long)this->localIndex_ * 8) = 0;
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    *(undefined8 *)
     (*(long *)((long)&(this->snapshotMan_->currentSnapshot_->atomData).flucQFrc.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + this->storage_) +
     (long)this->localIndex_ * 8) = 0;
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    setElectricField(this,(Vector3d *)OpenMD::V3Zero);
  }
  if ((uVar1 >> 0x11 & 1) != 0) {
    *(undefined8 *)
     (*(long *)((long)&(this->snapshotMan_->currentSnapshot_->atomData).sitePotential.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + this->storage_) +
     (long)this->localIndex_ * 8) = 0;
  }
  return;
}

Assistant:

void StuntDouble::zeroForcesAndTorques() {
    int sl = (snapshotMan_->getCurrentSnapshot()->*storage_).getStorageLayout();

    if (sl & DataStorage::dslForce) setFrc(V3Zero);
    if (sl & DataStorage::dslTorque) setTrq(V3Zero);
    if (sl & DataStorage::dslParticlePot) setParticlePot(0.0);
    if (sl & DataStorage::dslFlucQForce) setFlucQFrc(0.0);
    if (sl & DataStorage::dslElectricField) setElectricField(V3Zero);
    if (sl & DataStorage::dslSitePotential) setSitePotential(0.0);
  }